

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O2

void implementations::scheme::repl(string *prompt,env_p *env)

{
  ostream *poVar1;
  size_t __nbytes;
  cell *exp;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_130;
  string line;
  string local_100;
  cell local_e0;
  cell local_88;
  
  do {
    std::operator<<((ostream *)&std::cout,(string *)prompt);
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&line);
    read((int)&local_e0,&line,__nbytes);
    std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_130,
                 &env->
                  super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                );
    eval(&local_88,&local_e0,(env_p *)&local_130);
    to_string_abi_cxx11_(&local_100,(scheme *)&local_88,exp);
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_100);
    std::operator<<(poVar1,'\n');
    std::__cxx11::string::~string((string *)&local_100);
    cell::~cell(&local_88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_130._M_refcount);
    cell::~cell(&local_e0);
    std::__cxx11::string::~string((string *)&line);
  } while( true );
}

Assistant:

void repl(const std::string & prompt, env_p env)
{
	for (;;) {
		std::cout << prompt;
		std::string line; std::getline(std::cin, line);
		std::cout << to_string(eval(read(line), env)) << '\n';
	}
}